

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowpassSpeaker.hpp
# Opt level: O1

void __thiscall
Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>::PullLowpass
          (PullLowpass<Enterprise::Dave::Audio> *this,Audio *sample_source)

{
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker.delegate_._M_b._M_p = (__pointer_type)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker.completed_sample_sets_ = 0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker.input_rate_multiplier_ = 1.0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker.output_cycles_per_second_ = 1.0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker.output_buffer_size_ = 1;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker.stereo_output_._M_base._M_i = false;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker.mix_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker.mix_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker.mix_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  output_buffer_pointer_ = 0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  input_buffer_depth_ = 0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  input_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  input_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  input_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  output_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  output_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  output_buffer_.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).step_rate_
       = 0.0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  position_error_ = 0.0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).filter_.
  _M_t.
  super___uniq_ptr_impl<SignalProcessing::FIRFilter,_std::default_delete<SignalProcessing::FIRFilter>_>
  ._M_t.
  super__Tuple_impl<0UL,_SignalProcessing::FIRFilter_*,_std::default_delete<SignalProcessing::FIRFilter>_>
  .super__Head_base<0UL,_SignalProcessing::FIRFilter_*,_false>._M_head_impl = (FIRFilter *)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  filter_parameters_mutex_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)
   ((long)&(this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
           filter_parameters_mutex_.super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)
   ((long)&(this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
           filter_parameters_mutex_.super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  filter_parameters_mutex_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  filter_parameters_mutex_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  filter_parameters_.input_cycles_per_second = 0.0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  filter_parameters_.output_cycles_per_second = 0.0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  filter_parameters_.high_frequency_cutoff = -1.0;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  filter_parameters_.parameters_are_dirty = true;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  filter_parameters_.input_rate_changed = false;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  conversion_ = Copy;
  (this->super_LowpassBase<Outputs::Speaker::PullLowpass<Enterprise::Dave::Audio>,_true>).
  super_Speaker._vptr_Speaker = (_func_int **)&PTR__LowpassBase_005a0a60;
  this->sample_source_ = sample_source;
  Enterprise::Dave::Audio::set_sample_volume_range(sample_source,0x7fff);
  return;
}

Assistant:

PullLowpass(SampleSource &sample_source) : sample_source_(sample_source) {
			// Propagate an initial volume level.
			sample_source.set_sample_volume_range(32767);
		}